

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-custom-filter.cc
# Opt level: O0

void __thiscall Pl_XOR::~Pl_XOR(Pl_XOR *this)

{
  Pl_XOR *this_local;
  
  ~Pl_XOR(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

~Pl_XOR() override = default;